

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::reparentFocusWidgets(QWidgetPrivate *this,QWidget *oldtlw)

{
  QWidget *pQVar1;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  QWidget *q;
  FocusDirection in_stack_0000008c;
  QWidgetPrivate *in_stack_00000090;
  
  q_func(in_RDI);
  pQVar1 = QWidget::window(in_RSI);
  if (in_RSI != pQVar1) {
    if (in_RDI->focus_child != (QWidget *)0x0) {
      QWidget::clearFocus(q);
    }
    reparentFocusChildren(in_stack_00000090,in_stack_0000008c);
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentFocusWidgets(QWidget * oldtlw)
{
    Q_Q(QWidget);
    if (oldtlw == q->window())
        return; // nothing to do

    if (focus_child)
        focus_child->clearFocus();

    reparentFocusChildren(QWidgetPrivate::FocusDirection::Next);
}